

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.h
# Opt level: O0

void __thiscall charls::jpeg_stream_reader::jpeg_stream_reader(jpeg_stream_reader *this)

{
  jpeg_stream_reader *this_local;
  
  this->position_ = (iterator)0x0;
  this->end_position_ = (iterator)0x0;
  const_byte_span::const_byte_span(&this->segment_data_);
  (this->frame_info_).width = 0;
  (this->frame_info_).height = 0;
  (this->frame_info_).bits_per_sample = 0;
  (this->frame_info_).component_count = 0;
  (this->parameters_).near_lossless = 0;
  (this->parameters_).restart_interval = 0;
  (this->parameters_).interleave_mode = None;
  (this->parameters_).transformation = None;
  (this->parameters_).output_bgr = false;
  (this->preset_coding_parameters_).maximum_sample_value = 0;
  (this->preset_coding_parameters_).threshold1 = 0;
  (this->preset_coding_parameters_).threshold2 = 0;
  (this->preset_coding_parameters_).threshold3 = 0;
  (this->preset_coding_parameters_).reset_value = 0;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->component_ids_);
  this->state_ = before_start_of_image;
  (this->at_comment_callback_).handler = (_func_int_void_ptr_unsigned_long_void_ptr *)0x0;
  (this->at_comment_callback_).user_context = (void *)0x0;
  (this->at_application_data_callback_).handler =
       (_func_int_int_void_ptr_unsigned_long_void_ptr *)0x0;
  (this->at_application_data_callback_).user_context = (void *)0x0;
  return;
}

Assistant:

~jpeg_stream_reader() = default;